

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O1

Aig_Man_t * Ssw_SpeculativeReduction(Ssw_Man_t *p)

{
  char *__s;
  void *pvVar1;
  Aig_Man_t *p_00;
  size_t sVar2;
  char *__dest;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  Aig_Man_t *pAVar6;
  ulong uVar7;
  uint uVar8;
  Aig_Obj_t *p1;
  int iVar9;
  Aig_Obj_t *pAVar10;
  long lVar11;
  
  if (p->pFrames != (Aig_Man_t *)0x0) {
    __assert_fail("p->pFrames == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xd9,"Aig_Man_t *Ssw_SpeculativeReduction(Ssw_Man_t *)");
  }
  pAVar6 = p->pAig;
  if (pAVar6->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xda,"Aig_Man_t *Ssw_SpeculativeReduction(Ssw_Man_t *)");
  }
  if (pAVar6->nObjs[2] <= pAVar6->nRegs) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xdb,"Aig_Man_t *Ssw_SpeculativeReduction(Ssw_Man_t *)");
  }
  p->nConstrTotal = 0;
  p->nConstrReduced = 0;
  p_00 = Aig_ManStart(p->nFrames * pAVar6->vObjs->nSize);
  pAVar6 = p->pAig;
  __s = pAVar6->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar2 = strlen(__s);
    __dest = (char *)malloc(sVar2 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p->pNodeToFrames[(long)pAVar6->pConst1->Id * (long)p->nFrames] = p_00->pConst1;
  pAVar6 = p->pAig;
  if (0 < pAVar6->nTruePis) {
    lVar11 = 0;
    do {
      if (pAVar6->vCis->nSize <= lVar11) goto LAB_005da717;
      pvVar1 = pAVar6->vCis->pArray[lVar11];
      pAVar3 = Aig_ObjCreateCi(p_00);
      p->pNodeToFrames[(long)*(int *)((long)pvVar1 + 0x24) * (long)p->nFrames] = pAVar3;
      lVar11 = lVar11 + 1;
      pAVar6 = p->pAig;
    } while (lVar11 < pAVar6->nTruePis);
  }
  pAVar6 = p->pAig;
  if (0 < pAVar6->nRegs) {
    iVar9 = 0;
    do {
      uVar8 = pAVar6->nTruePis + iVar9;
      if (((int)uVar8 < 0) || (pAVar6->vCis->nSize <= (int)uVar8)) goto LAB_005da717;
      pvVar1 = pAVar6->vCis->pArray[uVar8];
      pAVar3 = Aig_ObjCreateCi(p_00);
      p->pNodeToFrames[(long)*(int *)((long)pvVar1 + 0x24) * (long)p->nFrames] = pAVar3;
      iVar9 = iVar9 + 1;
      pAVar6 = p->pAig;
    } while (iVar9 < pAVar6->nRegs);
  }
  pAVar6 = p->pAig;
  if (0 < pAVar6->nRegs) {
    iVar9 = 0;
    do {
      uVar8 = pAVar6->nTruePis + iVar9;
      if (((int)uVar8 < 0) || (pAVar6->vCis->nSize <= (int)uVar8)) goto LAB_005da717;
      Ssw_FramesConstrainNode(p,p_00,pAVar6,(Aig_Obj_t *)pAVar6->vCis->pArray[uVar8],0,0);
      iVar9 = iVar9 + 1;
      pAVar6 = p->pAig;
    } while (iVar9 < pAVar6->nRegs);
  }
  pVVar4 = p->pAig->vObjs;
  if (0 < pVVar4->nSize) {
    lVar11 = 0;
    do {
      pAVar3 = (Aig_Obj_t *)pVVar4->pArray[lVar11];
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
        if (((ulong)pAVar3 & 1) != 0) goto LAB_005da736;
        uVar5 = (ulong)pAVar3->pFanin0 & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar10 = (Aig_Obj_t *)
                    ((ulong)((uint)pAVar3->pFanin0 & 1) ^
                    (ulong)p->pNodeToFrames[(long)*(int *)(uVar5 + 0x24) * (long)p->nFrames]);
        }
        uVar5 = (ulong)pAVar3->pFanin1 & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)pAVar3->pFanin1 & 1) ^
               (ulong)p->pNodeToFrames[(long)*(int *)(uVar5 + 0x24) * (long)p->nFrames]);
        }
        pAVar10 = Aig_And(p_00,pAVar10,p1);
        p->pNodeToFrames[(long)pAVar3->Id * (long)p->nFrames] = pAVar10;
        Ssw_FramesConstrainNode(p,p_00,p->pAig,pAVar3,0,0);
      }
      lVar11 = lVar11 + 1;
      pVVar4 = p->pAig->vObjs;
    } while (lVar11 < pVVar4->nSize);
  }
  pAVar6 = p->pAig;
  if (0 < pAVar6->nRegs) {
    iVar9 = 0;
    do {
      uVar8 = pAVar6->nTruePos + iVar9;
      if (((int)uVar8 < 0) || (pAVar6->vCos->nSize <= (int)uVar8)) {
LAB_005da717:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAVar6->vCos->pArray[uVar8];
      if (((ulong)pvVar1 & 1) != 0) {
LAB_005da736:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswInt.h"
                      ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      uVar5 = *(ulong *)((long)pvVar1 + 8);
      uVar7 = uVar5 & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        pAVar3 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar3 = (Aig_Obj_t *)
                 ((ulong)((uint)uVar5 & 1) ^
                 (ulong)p->pNodeToFrames[(long)*(int *)(uVar7 + 0x24) * (long)p->nFrames]);
      }
      Aig_ObjCreateCo(p_00,pAVar3);
      iVar9 = iVar9 + 1;
      pAVar6 = p->pAig;
    } while (iVar9 < pAVar6->nRegs);
  }
  Aig_ManCleanup(p_00);
  Aig_ManSetRegNum(p_00,p->pAig->nRegs);
  return p_00;
}

Assistant:

Aig_Man_t * Ssw_SpeculativeReduction( Ssw_Man_t * p )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    assert( p->pFrames == NULL );
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    p->nConstrTotal = p->nConstrReduced = 0;

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->nFrames );
    pFrames->pName = Abc_UtilStrsav( p->pAig->pName );
    // map constants and PIs
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), 0, Aig_ManConst1(pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // create latches for the first frame
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // set the constraints on the latch outputs
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, 0, 0 );
    // add internal nodes of this frame
    Aig_ManForEachNode( p->pAig, pObj, i )
    {
        pObjNew = Aig_And( pFrames, Ssw_ObjChild0Fra(p, pObj, 0), Ssw_ObjChild1Fra(p, pObj, 0) );
        Ssw_ObjSetFrame( p, pObj, 0, pObjNew );
        Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, 0, 0 );
    }
    // add the POs for the latch outputs of the last frame
    Saig_ManForEachLi( p->pAig, pObj, i )
        Aig_ObjCreateCo( pFrames, Ssw_ObjChild0Fra(p, pObj,0) );
    // remove dangling nodes
    Aig_ManCleanup( pFrames );
    Aig_ManSetRegNum( pFrames, Aig_ManRegNum(p->pAig) );
//    Abc_Print( 1, "SpecRed: Total constraints = %d. Reduced constraints = %d.\n", 
//        p->nConstrTotal, p->nConstrReduced );
    return pFrames;
}